

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_time.c
# Opt level: O2

void hang_tick(t_hang_conflict *h)

{
  int iVar1;
  t_atomtype tVar2;
  _pipe *object;
  int iVar3;
  t_hang_conflict *ptVar4;
  _hang_conflict *p_Var5;
  t_hang_conflict **pptVar6;
  long lVar7;
  long lVar8;
  _outlet **pp_Var9;
  
  object = h->h_owner;
  p_Var5 = object->x_hang;
  if (object->x_hang == h) {
    pptVar6 = &object->x_hang;
    p_Var5 = h;
  }
  else {
    do {
      ptVar4 = p_Var5;
      p_Var5 = ptVar4->h_next;
      if (p_Var5 == (_hang_conflict *)0x0) goto LAB_0018851b;
    } while (p_Var5 != h);
    pptVar6 = &ptVar4->h_next;
  }
  *pptVar6 = p_Var5->h_next;
LAB_0018851b:
  iVar1 = object->x_n;
  lVar7 = (long)(iVar1 + -1);
  pp_Var9 = &object->x_vec[lVar7].p_outlet;
  for (lVar8 = 0; -iVar1 != (int)lVar8; lVar8 = lVar8 + -1) {
    tVar2 = (((t_pipeout *)(pp_Var9 + -2))->p_atom).a_type;
    if (tVar2 == A_POINTER) {
      iVar3 = gpointer_check(h->h_vec[lVar7 + lVar8].w_gpointer,1);
      if (iVar3 == 0) {
        pd_error(object,"pipe: stale pointer");
      }
      else {
        outlet_pointer(*pp_Var9,h->h_vec[lVar7 + lVar8].w_gpointer);
      }
    }
    else if (tVar2 == A_SYMBOL) {
      outlet_symbol(*pp_Var9,h->h_vec[lVar7 + lVar8].w_symbol);
    }
    else if (tVar2 == A_FLOAT) {
      outlet_float(*pp_Var9,h->h_vec[lVar7 + lVar8].w_float);
    }
    pp_Var9 = pp_Var9 + -3;
  }
  hang_free(h);
  return;
}

Assistant:

static void hang_tick(t_hang *h)
{
    t_pipe *x = h->h_owner;
    t_hang *h2, *h3;
    t_pipeout *p;
    int i;
    union word *w;
    if (x->x_hang == h) x->x_hang = h->h_next;
    else for (h2 = x->x_hang; (h3 = h2->h_next); h2 = h3)
    {
        if (h3 == h)
        {
            h2->h_next = h3->h_next;
            break;
        }
    }
    for (i = x->x_n, p = x->x_vec + (x->x_n - 1), w = h->h_vec + (x->x_n - 1);
        i--; p--, w--)
    {
        switch (p->p_atom.a_type)
        {
        case A_FLOAT: outlet_float(p->p_outlet, w->w_float); break;
        case A_SYMBOL: outlet_symbol(p->p_outlet, w->w_symbol); break;
        case A_POINTER:
            if (gpointer_check(w->w_gpointer, 1))
                outlet_pointer(p->p_outlet, w->w_gpointer);
            else pd_error(x, "pipe: stale pointer");
            break;
        default: break;
        }
    }
    hang_free(h);
}